

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtGC.c
# Opt level: O1

newtObjRef NewtObjChainAlloc(newtPool pool,size_t size,size_t dataSize)

{
  newtObjRef ptr;
  void *pvVar1;
  newtObjRef_conflict *ppnVar2;
  newtObjRef pnVar3;
  
  if ((ulong)(long)pool->maxspace < (long)pool->usesize + dataSize + size) {
    newt_env.needgc = true;
  }
  ptr = (newtObjRef)NewtMemAlloc(pool,size);
  if (ptr == (newtObjRef)0x0) {
LAB_0010692e:
    ptr = (newtObjRef)0x0;
  }
  else {
    (ptr->header).size = 0;
    (ptr->header).flags = 0;
    (ptr->header).nextp = (newtObjRef)0x0;
    if (dataSize == 0) {
      (ptr->header).size = 0;
      (ptr->header).flags = 0x40;
    }
    else {
      pvVar1 = NewtMemAlloc(pool,dataSize);
      if (pvVar1 == (void *)0x0) {
        NewtMemFree(ptr);
        goto LAB_0010692e;
      }
      *(void **)&ptr[1].header = pvVar1;
    }
    if (pool != (newtPool)0x0) {
      if (dataSize == 0) {
        ppnVar2 = &pool->literal;
        pnVar3 = pool->literal;
      }
      else {
        ppnVar2 = &pool->obj;
        pnVar3 = pool->obj;
      }
      if (pnVar3 != (newtObjRef)0x0) {
        (ptr->header).nextp = pnVar3;
      }
      *ppnVar2 = ptr;
      pool->usesize = pool->usesize + (int)(dataSize + size);
    }
  }
  return ptr;
}

Assistant:

newtObjRef NewtObjChainAlloc(newtPool pool, size_t size, size_t dataSize)
{
    newtObjRef	obj;
    
    NewtCheckGC(pool, size + dataSize);
    
    obj = (newtObjRef)NewtMemAlloc(pool, size);
    if (obj == NULL) return NULL;
    
    memset(&obj->header, 0, sizeof(obj->header));
    
    if (0 < dataSize)
    {
        uint8_t *	data;
        
        data = NewtMemAlloc(pool, dataSize);
        
        if (data == NULL)
        {
            NewtMemFree(obj);
            return NULL;
        }
        
        *((uint8_t **)(obj + 1)) = data;
    }
    else
    {
        obj->header.size = 0;
        obj->header.flags = kNewtObjLiteral;
    }
    
    if (pool != NULL)
    {
        NewtPoolChain(pool, obj, dataSize == 0);
        pool->usesize += size + dataSize;
    }
    
    return obj;
}